

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd.c
# Opt level: O2

size_t FSE_buildCTable_raw(FSE_CTable *ct,uint nbBits)

{
  byte bVar1;
  uint uVar2;
  size_t sVar3;
  ulong uVar4;
  
  bVar1 = (byte)nbBits & 0x1f;
  uVar2 = 1 << bVar1;
  if (nbBits == 0) {
    sVar3 = 0xffffffffffffffff;
  }
  else {
    *(short *)ct = (short)nbBits;
    *(short *)((long)ct + 2) = (short)uVar2 + -1;
    for (uVar4 = 0; uVar2 != uVar4; uVar4 = uVar4 + 1) {
      *(short *)((long)ct + uVar4 * 2 + 4) = (short)uVar2 + (short)uVar4;
    }
    sVar3 = (size_t)(uint)(0 << bVar1);
    for (uVar4 = 0; uVar2 != uVar4; uVar4 = uVar4 + 1) {
      ct[(ulong)(uVar2 >> 1) + uVar4 * 2 + 2] = nbBits * 0x10000 - uVar2;
      ct[(ulong)(uVar2 >> 1) + uVar4 * 2 + 1] = (int)uVar4 - 1;
    }
  }
  return sVar3;
}

Assistant:

size_t FSE_buildCTable_raw (FSE_CTable* ct, unsigned nbBits)
{
    const unsigned tableSize = 1 << nbBits;
    const unsigned tableMask = tableSize - 1;
    const unsigned maxSymbolValue = tableMask;
    void* const ptr = ct;
    U16* const tableU16 = ( (U16*) ptr) + 2;
    void* const FSCT = ((U32*)ptr) + 1 /* header */ + (tableSize>>1);   /* assumption : tableLog >= 1 */
    FSE_symbolCompressionTransform* const symbolTT = (FSE_symbolCompressionTransform*) (FSCT);
    unsigned s;

    /* Sanity checks */
    if (nbBits < 1) return ERROR(GENERIC);             /* min size */

    /* header */
    tableU16[-2] = (U16) nbBits;
    tableU16[-1] = (U16) maxSymbolValue;

    /* Build table */
    for (s=0; s<tableSize; s++)
        tableU16[s] = (U16)(tableSize + s);

    /* Build Symbol Transformation Table */
    {   const U32 deltaNbBits = (nbBits << 16) - (1 << nbBits);
        for (s=0; s<=maxSymbolValue; s++) {
            symbolTT[s].deltaNbBits = deltaNbBits;
            symbolTT[s].deltaFindState = s-1;
    }   }

    return 0;
}